

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O3

MainBuilder * __thiscall
kj::MainBuilder::addOption
          (MainBuilder *this,initializer_list<kj::MainBuilder::OptionName> names,
          Function<kj::MainBuilder::Validity_()> *callback,StringPtr helpText)

{
  Function<kj::MainBuilder::Validity_()> *pFVar1;
  Option *pOVar2;
  
  pFVar1 = Arena::
           allocate<kj::Function<kj::MainBuilder::Validity()>,kj::Function<kj::MainBuilder::Validity()>>
                     (&((this->impl).ptr)->arena,callback);
  pOVar2 = Impl::addOption((this->impl).ptr,names,false,helpText);
  (pOVar2->field_2).func = pFVar1;
  return this;
}

Assistant:

MainBuilder& MainBuilder::addOption(std::initializer_list<OptionName> names,
                                    Function<Validity()> callback,
                                    StringPtr helpText) {
  impl->addOption(names, false, helpText).func = &impl->arena.copy(kj::mv(callback));
  return *this;
}